

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeCoTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  Status stat;
  pointer pnVar1;
  SPxOut *pSVar2;
  ostream *poVar3;
  undefined8 uVar4;
  char cVar5;
  int iVar6;
  long_long_type lVar7;
  long lVar8;
  long lVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  char *pcVar12;
  uint *puVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  long lVar15;
  long lVar16;
  byte bVar17;
  Verbosity old_verbosity_1;
  cpp_dec_float<200U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  int local_250;
  Verbosity local_244;
  DIdxSet *local_240;
  cpp_dec_float<200U,_int,_void> local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar17 = 0;
  leavetol(&local_1b8,this);
  this->m_pricingViolUpToDate = true;
  this_00 = &this->m_pricingViol;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&this_00->m_backend,0);
  this->m_numViol = 0;
  (this->infeasibilities).super_IdxSet.num = 0;
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_238,(long)(this->thecovectors->set).thenum,(type *)0x0);
  if (&local_138 != &(this->sparsePricingFactor).m_backend) {
    pnVar11 = &this->sparsePricingFactor;
    pcVar10 = &local_138;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pcVar10->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + (ulong)bVar17 * -8 + 4);
      pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar17 * -8 + 4);
    }
    local_138.exp = (this->sparsePricingFactor).m_backend.exp;
    local_138.neg = (this->sparsePricingFactor).m_backend.neg;
    local_138.fpclass = (this->sparsePricingFactor).m_backend.fpclass;
    local_138.prec_elem = (this->sparsePricingFactor).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(&local_138,&local_238)
  ;
  lVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_signed_long_long
                    (&local_138);
  lVar8 = -0x80000000;
  if (-0x80000000 < lVar7) {
    lVar8 = lVar7;
  }
  if (0x7ffffffe < lVar8) {
    lVar8 = 0x7fffffff;
  }
  lVar16 = (long)(this->thecovectors->set).thenum;
  if (0 < lVar16) {
    local_240 = &this->infeasibilities;
    lVar15 = lVar16 + 1;
    lVar16 = lVar16 << 7;
    do {
      stat = ((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.costat)->data[lVar15 + -2];
      if (this->theRep * stat < 1) {
        coTest((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_238,this,(int)lVar15 + -2,stat);
        pnVar1 = (this->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar10 = &local_238;
        puVar13 = (uint *)((long)pnVar1[-1].m_backend.data._M_elems + lVar16);
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar13 = (pcVar10->data)._M_elems[0];
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar17 * -8 + 4);
          puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
        }
        *(int *)((long)(&pnVar1[-1].m_backend.data + 1) + lVar16) = local_238.exp;
        *(bool *)((long)(&pnVar1[-1].m_backend.data + 1) + lVar16 + 4U) = local_238.neg;
        *(undefined8 *)((long)(&pnVar1[-1].m_backend.data + 1) + lVar16 + 8U) = local_238._120_8_;
        pnVar1 = (this->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)pnVar1[-1].m_backend.data._M_elems + lVar16);
        if (this->remainingRoundsEnter == 0) {
          pnVar11 = &local_1b8;
          pcVar14 = &local_238;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar14->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar17 * -8 + 4);
          }
          local_238.exp = local_1b8.m_backend.exp;
          local_238.neg = local_1b8.m_backend.neg;
          local_238.fpclass = local_1b8.m_backend.fpclass;
          local_238.prec_elem = local_1b8.m_backend.prec_elem;
          if (local_238.data._M_elems[0] != ERROR ||
              local_1b8.m_backend.fpclass != cpp_dec_float_finite) {
            local_238.neg = (bool)(local_1b8.m_backend.neg ^ 1);
          }
          if (((local_1b8.m_backend.fpclass == cpp_dec_float_NaN) ||
              (*(int *)((long)(&pnVar1[-1].m_backend.data + 1) + lVar16 + 8U) == 2)) ||
             (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar10,&local_238), -1 < iVar6)) {
            (this->isInfeasible).data[lVar15 + -2] = 0;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       (cpp_dec_float<200U,_int,_void> *)
                       ((long)(this->theCoTest).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                       + lVar16));
            DIdxSet::addIdx(local_240,(int)lVar15 + -2);
            (this->isInfeasible).data[lVar15 + -2] = 1;
            this->m_numViol = this->m_numViol + 1;
          }
          if ((int)lVar8 < (this->infeasibilities).super_IdxSet.num) {
            pSVar2 = this->spxout;
            if ((pSVar2 != (SPxOut *)0x0) && (3 < (int)pSVar2->m_verbosity)) {
              local_138.data._M_elems[0] = 4;
              local_238.data._M_elems[0] = pSVar2->m_verbosity;
              (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_138);
              pSVar2 = this->spxout;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar2->m_streams[pSVar2->m_verbosity]," --- using dense pricing",0x18);
              cVar5 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
              std::ios::widen((char)*(undefined8 *)
                                     (*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18) +
                              cVar5);
              std::ostream::put(cVar5);
              std::ostream::flush();
              (*this->spxout->_vptr_SPxOut[2])();
            }
            this->remainingRoundsEnter = 5;
            this->sparsePricingEnter = false;
            (this->infeasibilities).super_IdxSet.num = 0;
          }
        }
        else {
          pnVar11 = &local_1b8;
          pcVar14 = &local_238;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar14->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar17 * -8 + 4);
          }
          local_238.exp = local_1b8.m_backend.exp;
          local_238.neg = local_1b8.m_backend.neg;
          local_238.fpclass = local_1b8.m_backend.fpclass;
          local_238.prec_elem = local_1b8.m_backend.prec_elem;
          if (local_238.data._M_elems[0] != ERROR ||
              local_1b8.m_backend.fpclass != cpp_dec_float_finite) {
            local_238.neg = (bool)(local_1b8.m_backend.neg ^ 1);
          }
          if (((local_1b8.m_backend.fpclass != cpp_dec_float_NaN) &&
              (*(int *)((long)(&pnVar1[-1].m_backend.data + 1) + lVar16 + 8U) != 2)) &&
             (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar10,&local_238), iVar6 < 0)) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       (cpp_dec_float<200U,_int,_void> *)
                       ((long)(this->theCoTest).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                       + lVar16));
            this->m_numViol = this->m_numViol + 1;
          }
        }
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)
                   ((long)(this->theCoTest).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                   lVar16),0);
        if (this->remainingRoundsEnter == 0) {
          (this->isInfeasible).data[lVar15 + -2] = 0;
        }
      }
      lVar15 = lVar15 + -1;
      lVar16 = lVar16 + -0x80;
    } while (1 < lVar15);
  }
  iVar6 = (this->infeasibilities).super_IdxSet.num;
  if ((iVar6 == 0) && (this->sparsePricingEnter == false)) {
    this->remainingRoundsEnter = this->remainingRoundsEnter + -1;
  }
  else if ((iVar6 <= (int)lVar8) && (this->sparsePricingEnter == false)) {
    pSVar2 = this->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (local_244 = pSVar2->m_verbosity, 3 < (int)local_244)) {
      local_238.data._M_elems[0] = 4;
      (*pSVar2->_vptr_SPxOut[2])();
      poVar3 = this->spxout->m_streams[this->spxout->m_verbosity];
      uVar4 = *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8);
      if (this->hyperPricingEnter == true) {
        pcVar12 = " --- using hypersparse pricing, ";
        lVar8 = 0x20;
      }
      else {
        pcVar12 = " --- using sparse pricing, ";
        lVar8 = 0x1b;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar12,lVar8);
      pSVar2 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar2->m_streams[pSVar2->m_verbosity],"sparsity: ",10);
      poVar3 = pSVar2->m_streams[pSVar2->m_verbosity];
      lVar8 = *(long *)poVar3;
      *(undefined8 *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x10) = 6;
      *(uint *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar3 + *(long *)(lVar8 + -0x18) + 8) = 4;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_138,(long)(this->infeasibilities).super_IdxSet.num,(type *)0x0);
      local_b8.fpclass = cpp_dec_float_finite;
      local_b8.prec_elem = 0x1c;
      local_b8.data._M_elems[0] = 0;
      local_b8.data._M_elems[1] = 0;
      local_b8.data._M_elems[2] = 0;
      local_b8.data._M_elems[3] = 0;
      local_b8.data._M_elems[4] = 0;
      local_b8.data._M_elems[5] = 0;
      local_b8.data._M_elems[6] = 0;
      local_b8.data._M_elems[7] = 0;
      local_b8.data._M_elems[8] = 0;
      local_b8.data._M_elems[9] = 0;
      local_b8.data._M_elems[10] = 0;
      local_b8.data._M_elems[0xb] = 0;
      local_b8.data._M_elems[0xc] = 0;
      local_b8.data._M_elems[0xd] = 0;
      local_b8.data._M_elems[0xe] = 0;
      local_b8.data._M_elems[0xf] = 0;
      local_b8.data._M_elems[0x10] = 0;
      local_b8.data._M_elems[0x11] = 0;
      local_b8.data._M_elems[0x12] = 0;
      local_b8.data._M_elems[0x13] = 0;
      local_b8.data._M_elems[0x14] = 0;
      local_b8.data._M_elems[0x15] = 0;
      local_b8.data._M_elems[0x16] = 0;
      local_b8.data._M_elems[0x17] = 0;
      local_b8.data._M_elems[0x18] = 0;
      local_b8.data._M_elems[0x19] = 0;
      local_b8.data._M_elems._104_5_ = 0;
      local_b8.data._M_elems[0x1b]._1_3_ = 0;
      local_b8.exp = 0;
      local_b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_238,(long)(this->thecovectors->set).thenum,(type *)0x0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_b8,&local_138,&local_238);
      boost::multiprecision::operator<<
                (pSVar2->m_streams[pSVar2->m_verbosity],
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_b8);
      poVar3 = pSVar2->m_streams[pSVar2->m_verbosity];
      lVar8 = *(long *)poVar3;
      *(uint *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      local_250 = (int)uVar4;
      *(long *)(poVar3 + *(long *)(lVar8 + -0x18) + 8) = (long)local_250;
      std::ios::widen((char)*(undefined8 *)(lVar8 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_244);
    }
    this->sparsePricingEnter = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeCoTest()
{
   int i;
   R pricingTol = leavetol();
   m_pricingViolUpToDate = true;
   m_pricingViol = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());
   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(i = dim() - 1; i >= 0; --i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(i);

      if(isBasic(stat))
      {
         theCoTest[i] = 0;

         if(remainingRoundsEnter == 0)
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         theCoTest[i] = coTest(i, stat);

         if(remainingRoundsEnter == 0)
         {
            if(theCoTest[i] < -pricingTol)
            {
               assert(infeasibilities.size() < infeasibilities.max());
               m_pricingViol -= theCoTest[i];
               infeasibilities.addIdx(i);
               isInfeasible[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilities.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnter = SOPLEX_DENSEROUNDS;
               sparsePricingEnter = false;
               infeasibilities.clear();
            }
         }
         else if(theCoTest[i] < -pricingTol)
         {
            m_pricingViol -= theCoTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingEnter)
      --remainingRoundsEnter;
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingEnter)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilities.size() / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnter = true;
   }
}